

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall
Constructor::markSubtableOperands(Constructor *this,vector<int,_std::allocator<int>_> *check)

{
  int iVar1;
  pointer ppOVar2;
  int iVar3;
  ulong uVar4;
  
  std::vector<int,_std::allocator<int>_>::resize
            (check,(long)(this->operands).
                         super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->operands).
                         super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3);
  ppOVar2 = (this->operands).super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->operands).super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppOVar2) {
    uVar4 = 0;
    do {
      if (ppOVar2[uVar4]->triple == (TripleSymbol *)0x0) {
LAB_0032136e:
        iVar3 = 2;
      }
      else {
        iVar1 = (*(ppOVar2[uVar4]->triple->super_SleighSymbol)._vptr_SleighSymbol[2])();
        iVar3 = 0;
        if (iVar1 != 0xb) goto LAB_0032136e;
      }
      (check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = iVar3;
      uVar4 = uVar4 + 1;
      ppOVar2 = (this->operands).
                super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->operands).
                                   super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void Constructor::markSubtableOperands(vector<int4> &check) const

{ // Adjust -check- so it has one entry for every operand, a 0 if it is a subtable, a 2 if it is not
  check.resize(operands.size());
  for(int4 i=0;i<operands.size();++i) {
    TripleSymbol *sym = operands[i]->getDefiningSymbol();
    if ((sym != (TripleSymbol *)0)&&(sym->getType() == SleighSymbol::subtable_symbol))
      check[i] = 0;
    else
      check[i] = 2;
  }
}